

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DatabaseInterface::add_to_implicit_whitelist
          (DatabaseInterface *this,DatabaseInterface *iface)

{
  bool bVar1;
  undefined1 local_60 [8];
  anon_class_32_4_59f9b58c promote;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  DatabaseInterface *iface_local;
  DatabaseInterface *this_local;
  
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)iface;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size);
  promote.this = (DatabaseInterface *)0x0;
  local_60 = (undefined1  [8])
             hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  promote.iface = (DatabaseInterface *)&promote.this;
  promote.size = &size;
  promote.hashes = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  bVar1 = add_to_implicit_whitelist::anon_class_32_4_59f9b58c::operator()
                    ((anon_class_32_4_59f9b58c *)local_60,RESOURCE_SHADER_MODULE);
  if (bVar1) {
    bVar1 = add_to_implicit_whitelist::anon_class_32_4_59f9b58c::operator()
                      ((anon_class_32_4_59f9b58c *)local_60,RESOURCE_GRAPHICS_PIPELINE);
    if (bVar1) {
      bVar1 = add_to_implicit_whitelist::anon_class_32_4_59f9b58c::operator()
                        ((anon_class_32_4_59f9b58c *)local_60,RESOURCE_COMPUTE_PIPELINE);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size);
  return this_local._7_1_;
}

Assistant:

bool DatabaseInterface::add_to_implicit_whitelist(DatabaseInterface &iface)
{
	std::vector<Hash> hashes;
	size_t size = 0;

	const auto promote = [&](ResourceTag tag) -> bool {
		if (!iface.get_hash_list_for_resource_tag(tag, &size, nullptr))
			return false;
		hashes.resize(size);
		if (!iface.get_hash_list_for_resource_tag(tag, &size, hashes.data()))
			return false;
		for (auto &h : hashes)
			impl->implicit_whitelisted[tag].insert(h);
		return true;
	};

	if (!promote(RESOURCE_SHADER_MODULE))
		return false;
	if (!promote(RESOURCE_GRAPHICS_PIPELINE))
		return false;
	if (!promote(RESOURCE_COMPUTE_PIPELINE))
		return false;

	return true;
}